

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall CCard::CCard(CCard *this,istream *in)

{
  byte bVar1;
  int iVar2;
  runtime_error *this_00;
  size_type *local_60;
  string card;
  long local_30 [2];
  
  this->m_value = 0;
  this->m_suit = 0;
  card._M_dataplus._M_p = (pointer)0x0;
  card._M_string_length._0_1_ = 0;
  local_60 = &card._M_string_length;
  std::operator>>(in,(string *)&local_60);
  std::istream::ignore();
  bVar1 = (byte)*local_60;
  if ((char)bVar1 < 0x32) {
    if (bVar1 != 0x31) goto LAB_00102c19;
    this->m_value = 10;
    std::__cxx11::string::substr((ulong)((long)&card.field_2 + 8),(ulong)&local_60);
LAB_00102bf1:
    std::__cxx11::string::operator=((string *)&local_60,(string *)(card.field_2._M_local_buf + 8));
    if ((long *)card.field_2._8_8_ != local_30) {
      operator_delete((void *)card.field_2._8_8_,local_30[0] + 1);
    }
  }
  else {
    if (bVar1 < 0x3a) {
      this->m_value = (char)bVar1 + -0x30;
      std::__cxx11::string::substr((ulong)((long)&card.field_2 + 8),(ulong)&local_60);
      goto LAB_00102bf1;
    }
    if (0x4a < bVar1) {
      if (bVar1 == 0x4b) {
        this->m_value = 0xd;
        std::__cxx11::string::substr((ulong)((long)&card.field_2 + 8),(ulong)&local_60);
      }
      else {
        if (bVar1 != 0x51) goto LAB_00102c19;
        this->m_value = 0xc;
        std::__cxx11::string::substr((ulong)((long)&card.field_2 + 8),(ulong)&local_60);
      }
      goto LAB_00102bf1;
    }
    if (bVar1 == 0x41) {
      this->m_value = 0xe;
      std::__cxx11::string::substr((ulong)((long)&card.field_2 + 8),(ulong)&local_60);
      goto LAB_00102bf1;
    }
    if (bVar1 == 0x4a) {
      this->m_value = 0xb;
      std::__cxx11::string::substr((ulong)((long)&card.field_2 + 8),(ulong)&local_60);
      goto LAB_00102bf1;
    }
  }
LAB_00102c19:
  bVar1 = (byte)*local_60;
  if (bVar1 < 0x48) {
    if (bVar1 == 0x43) {
      iVar2 = 3;
    }
    else {
      iVar2 = 1;
      if (bVar1 != 0x44) {
LAB_00102d2d:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unexpected suit");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else if (bVar1 == 0x53) {
    iVar2 = 4;
  }
  else {
    if (bVar1 != 0x48) goto LAB_00102d2d;
    iVar2 = 2;
  }
  this->m_suit = iVar2;
  if (local_60 != &card._M_string_length) {
    operator_delete(local_60,CONCAT71(card._M_string_length._1_7_,(undefined1)card._M_string_length)
                             + 1);
  }
  return;
}

Assistant:

CCard(std::istream& in): m_value(0), m_suit(0)
        {
            std::string card;
            in >> card;
            in.ignore();
            if ('2' <= card[0] && '9' >= card[0])
            {
                m_value = card[0] - '0';
                card = card.substr(1);
            }
            else if ('1' == card[0])
            {
                m_value = 10;
                card = card.substr(2);
            }
            else if ('J' == card[0])
            {
                m_value = 11;
                card = card.substr(1);
            }
            else if ('Q' == card[0])
            {
                m_value = 12;
                card = card.substr(1);
            }
            else if ('K' == card[0])
            {
                m_value = 13;
                card = card.substr(1);
            }
            else if ('A' == card[0])
            {
                m_value = 14;
                card = card.substr(1);
            }
            
            switch (card[0])
            {
                case 'D':
                    m_suit = 1;
                    break;
                    
                case 'H':
                    m_suit = 2;
                    break;
                    
                case 'C':
                    m_suit = 3;
                    break;
                    
                case 'S':
                    m_suit = 4;
                    break;
                    
                default:
                    throw std::runtime_error("Unexpected suit");
            }
        }